

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  bool bVar1;
  QueryType type_local;
  int refValue_local;
  GLenum pname_local;
  int level_local;
  GLenum target_local;
  CallLogWrapper *gl_local;
  
  bVar1 = verifyTextureLevelParameterEqualWithPrinter<deqp::gles31::Functional::(anonymous_namespace)::IntegerPrinter>
                    (gl,target,level,pname,refValue,type);
  return bVar1;
}

Assistant:

static bool verifyTextureLevelParameterEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	return verifyTextureLevelParameterEqualWithPrinter<IntegerPrinter>(gl, target, level, pname, refValue, type);
}